

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O3

char * IDAGetReturnFlagName(long flag)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  
  pcVar1 = (char *)malloc(0x18);
  switch(flag) {
  case 0:
    builtin_strncpy(pcVar1,"IDA_SUCCESS",0xc);
    break;
  case 1:
    uVar5._0_1_ = 'T';
    uVar5._1_1_ = 'S';
    uVar5._2_1_ = 'T';
    uVar5._3_1_ = 'O';
    uVar8._0_1_ = 'P';
    uVar8._1_1_ = '_';
    uVar8._2_1_ = 'R';
    uVar8._3_1_ = 'E';
    uVar11._0_1_ = 'T';
    uVar11._1_1_ = 'U';
    uVar11._2_1_ = 'R';
    uVar11._3_1_ = 'N';
LAB_0011263d:
    pcVar1[0] = 'I';
    pcVar1[1] = 'D';
    pcVar1[2] = 'A';
    pcVar1[3] = '_';
    *(undefined4 *)(pcVar1 + 4) = uVar5;
    *(undefined4 *)(pcVar1 + 8) = uVar8;
    *(undefined4 *)(pcVar1 + 0xc) = uVar11;
    pcVar1[0x10] = '\0';
    break;
  case 2:
    uVar4._0_1_ = 'R';
    uVar4._1_1_ = 'O';
    uVar4._2_1_ = 'O';
    uVar4._3_1_ = 'T';
    uVar7._0_1_ = '_';
    uVar7._1_1_ = 'R';
    uVar7._2_1_ = 'E';
    uVar7._3_1_ = 'T';
    uVar10._0_1_ = 'U';
    uVar10._1_1_ = 'R';
    uVar10._2_1_ = 'N';
    uVar10._3_1_ = '\0';
LAB_00112631:
    pcVar1[0] = 'I';
    pcVar1[1] = 'D';
    pcVar1[2] = 'A';
    pcVar1[3] = '_';
    *(undefined4 *)(pcVar1 + 4) = uVar4;
    *(undefined4 *)(pcVar1 + 8) = uVar7;
    *(undefined4 *)(pcVar1 + 0xc) = uVar10;
    break;
  case -0x1a:
    builtin_strncpy(pcVar1,"IDA_BAD_T",10);
    break;
  default:
    builtin_strncpy(pcVar1,"NONE",5);
    break;
  case -0x18:
    builtin_strncpy(pcVar1,"IDA_BAD_EWT",0xc);
    break;
  case -0x17:
    builtin_strncpy(pcVar1 + 6,"_MALLOC",8);
    uVar2 = 0x4d5f4f4e5f414449;
    goto LAB_00112625;
  case -0x16:
    builtin_strncpy(pcVar1 + 6,"L_INPUT",8);
    uVar2 = 0x5f4c4c495f414449;
    goto LAB_00112625;
  case -0x15:
    uVar2 = 0x4c4941465f4d45;
    goto LAB_0011253d;
  case -0x14:
    uVar2 = 0x4c4c554e5f4d45;
LAB_0011253d:
    *(undefined8 *)(pcVar1 + 5) = uVar2;
    uVar2 = 0x5f4d454d5f414449;
    goto LAB_00112625;
  case -0x11:
    builtin_strncpy(pcVar1 + 5,"LS_FAIL",8);
    uVar2 = 0x5f534c4e5f414449;
    goto LAB_00112625;
  case -0x10:
    uVar3._0_1_ = 'N';
    uVar3._1_1_ = 'L';
    uVar3._2_1_ = 'S';
    uVar3._3_1_ = '_';
    uVar6._0_1_ = 'S';
    uVar6._1_1_ = 'E';
    uVar6._2_1_ = 'T';
    uVar6._3_1_ = 'U';
    uVar9._0_1_ = 'P';
    uVar9._1_1_ = '_';
    uVar9._2_1_ = 'F';
    uVar9._3_1_ = 'A';
    goto LAB_001125bf;
  case -0xe:
    uVar4._0_1_ = 'N';
    uVar4._1_1_ = 'O';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'R';
    uVar7._0_1_ = 'E';
    uVar7._1_1_ = 'C';
    uVar7._2_1_ = 'O';
    uVar7._3_1_ = 'V';
    uVar10._0_1_ = 'E';
    uVar10._1_1_ = 'R';
    uVar10._2_1_ = 'Y';
    uVar10._3_1_ = '\0';
    goto LAB_00112631;
  case -0xd:
    builtin_strncpy(pcVar1,"IDA_LINESEARCH_FAIL",0x14);
    break;
  case -0xc:
    uVar3._0_1_ = 'F';
    uVar3._1_1_ = 'I';
    uVar3._2_1_ = 'R';
    uVar3._3_1_ = 'S';
    uVar6._0_1_ = 'T';
    uVar6._1_1_ = '_';
    uVar6._2_1_ = 'R';
    uVar6._3_1_ = 'E';
    uVar9._0_1_ = 'S';
    uVar9._1_1_ = '_';
    uVar9._2_1_ = 'F';
    uVar9._3_1_ = 'A';
LAB_001125bf:
    pcVar1[0] = 'I';
    pcVar1[1] = 'D';
    pcVar1[2] = 'A';
    pcVar1[3] = '_';
    *(undefined4 *)(pcVar1 + 4) = uVar3;
    *(undefined4 *)(pcVar1 + 8) = uVar6;
    *(undefined4 *)(pcVar1 + 0xc) = uVar9;
    pcVar1[0xf] = 'A';
    pcVar1[0x10] = 'I';
    pcVar1[0x11] = 'L';
    pcVar1[0x12] = '\0';
    break;
  case -0xb:
    uVar4._0_1_ = 'C';
    uVar4._1_1_ = 'O';
    uVar4._2_1_ = 'N';
    uVar4._3_1_ = 'S';
    uVar7._0_1_ = 'T';
    uVar7._1_1_ = 'R';
    uVar7._2_1_ = '_';
    uVar7._3_1_ = 'F';
    uVar10._0_1_ = 'A';
    uVar10._1_1_ = 'I';
    uVar10._2_1_ = 'L';
    uVar10._3_1_ = '\0';
    goto LAB_00112631;
  case -10:
    uVar4._0_1_ = 'R';
    uVar4._1_1_ = 'T';
    uVar4._2_1_ = 'F';
    uVar4._3_1_ = 'U';
    uVar7._0_1_ = 'N';
    uVar7._1_1_ = 'C';
    uVar7._2_1_ = '_';
    uVar7._3_1_ = 'F';
    uVar10._0_1_ = 'A';
    uVar10._1_1_ = 'I';
    uVar10._2_1_ = 'L';
    uVar10._3_1_ = '\0';
    goto LAB_00112631;
  case -9:
    uVar4._0_1_ = 'R';
    uVar4._1_1_ = 'E';
    uVar4._2_1_ = 'P';
    uVar4._3_1_ = '_';
    uVar7._0_1_ = 'R';
    uVar7._1_1_ = 'E';
    uVar7._2_1_ = 'S';
    uVar7._3_1_ = '_';
    uVar10._0_1_ = 'E';
    uVar10._1_1_ = 'R';
    uVar10._2_1_ = 'R';
    uVar10._3_1_ = '\0';
    goto LAB_00112631;
  case -8:
    builtin_strncpy(pcVar1 + 5,"ES_FAIL",8);
    uVar2 = 0x5f5345525f414449;
    goto LAB_00112625;
  case -7:
    uVar4._0_1_ = 'L';
    uVar4._1_1_ = 'S';
    uVar4._2_1_ = 'O';
    uVar4._3_1_ = 'L';
    uVar7._0_1_ = 'V';
    uVar7._1_1_ = 'E';
    uVar7._2_1_ = '_';
    uVar7._3_1_ = 'F';
    uVar10._0_1_ = 'A';
    uVar10._1_1_ = 'I';
    uVar10._2_1_ = 'L';
    uVar10._3_1_ = '\0';
    goto LAB_00112631;
  case -6:
    uVar4._0_1_ = 'L';
    uVar4._1_1_ = 'S';
    uVar4._2_1_ = 'E';
    uVar4._3_1_ = 'T';
    uVar7._0_1_ = 'U';
    uVar7._1_1_ = 'P';
    uVar7._2_1_ = '_';
    uVar7._3_1_ = 'F';
    uVar10._0_1_ = 'A';
    uVar10._1_1_ = 'I';
    uVar10._2_1_ = 'L';
    uVar10._3_1_ = '\0';
    goto LAB_00112631;
  case -5:
    builtin_strncpy(pcVar1 + 7,"IT_FAIL",8);
    uVar2 = 0x494e494c5f414449;
    goto LAB_00112625;
  case -4:
    builtin_strncpy(pcVar1 + 6,"NV_FAIL",8);
    uVar2 = 0x564e4f435f414449;
    goto LAB_00112625;
  case -3:
    builtin_strncpy(pcVar1 + 5,"RR_FAIL",8);
    uVar2 = 0x5f5252455f414449;
LAB_00112625:
    *(undefined8 *)pcVar1 = uVar2;
    break;
  case -2:
    uVar5._0_1_ = 'T';
    uVar5._1_1_ = 'O';
    uVar5._2_1_ = 'O';
    uVar5._3_1_ = '_';
    uVar8._0_1_ = 'M';
    uVar8._1_1_ = 'U';
    uVar8._2_1_ = 'C';
    uVar8._3_1_ = 'H';
    uVar11._0_1_ = '_';
    uVar11._1_1_ = 'A';
    uVar11._2_1_ = 'C';
    uVar11._3_1_ = 'C';
    goto LAB_0011263d;
  case -1:
    builtin_strncpy(pcVar1,"IDA_TOO_MUCH_WORK",0x12);
  }
  return pcVar1;
}

Assistant:

char* IDAGetReturnFlagName(long int flag)
{
  char* name;

  name = (char*)malloc(24 * sizeof(char));

  switch (flag)
  {
  case IDA_SUCCESS: sprintf(name, "IDA_SUCCESS"); break;
  case IDA_TSTOP_RETURN: sprintf(name, "IDA_TSTOP_RETURN"); break;
  case IDA_ROOT_RETURN: sprintf(name, "IDA_ROOT_RETURN"); break;
  case IDA_TOO_MUCH_WORK: sprintf(name, "IDA_TOO_MUCH_WORK"); break;
  case IDA_TOO_MUCH_ACC: sprintf(name, "IDA_TOO_MUCH_ACC"); break;
  case IDA_ERR_FAIL: sprintf(name, "IDA_ERR_FAIL"); break;
  case IDA_CONV_FAIL: sprintf(name, "IDA_CONV_FAIL"); break;
  case IDA_LINIT_FAIL: sprintf(name, "IDA_LINIT_FAIL"); break;
  case IDA_LSETUP_FAIL: sprintf(name, "IDA_LSETUP_FAIL"); break;
  case IDA_LSOLVE_FAIL: sprintf(name, "IDA_LSOLVE_FAIL"); break;
  case IDA_CONSTR_FAIL: sprintf(name, "IDA_CONSTR_FAIL"); break;
  case IDA_RES_FAIL: sprintf(name, "IDA_RES_FAIL"); break;
  case IDA_FIRST_RES_FAIL: sprintf(name, "IDA_FIRST_RES_FAIL"); break;
  case IDA_REP_RES_ERR: sprintf(name, "IDA_REP_RES_ERR"); break;
  case IDA_RTFUNC_FAIL: sprintf(name, "IDA_RTFUNC_FAIL"); break;
  case IDA_MEM_FAIL: sprintf(name, "IDA_MEM_FAIL"); break;
  case IDA_MEM_NULL: sprintf(name, "IDA_MEM_NULL"); break;
  case IDA_ILL_INPUT: sprintf(name, "IDA_ILL_INPUT"); break;
  case IDA_NO_MALLOC: sprintf(name, "IDA_NO_MALLOC"); break;
  case IDA_BAD_T: sprintf(name, "IDA_BAD_T"); break;
  case IDA_BAD_EWT: sprintf(name, "IDA_BAD_EWT"); break;
  case IDA_NO_RECOVERY: sprintf(name, "IDA_NO_RECOVERY"); break;
  case IDA_LINESEARCH_FAIL: sprintf(name, "IDA_LINESEARCH_FAIL"); break;
  case IDA_NLS_SETUP_FAIL: sprintf(name, "IDA_NLS_SETUP_FAIL"); break;
  case IDA_NLS_FAIL: sprintf(name, "IDA_NLS_FAIL"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}